

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  byte bVar1;
  char *__s;
  byte bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  CURLcode CVar6;
  CURLUcode CVar7;
  size_t sVar8;
  Curl_handler *pCVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  size_t buflen;
  size_t sVar14;
  dynbuf *mem;
  uint uVar15;
  uchar *i;
  bool bVar16;
  char *oldurl;
  char *decoded;
  uchar out [3];
  uint local_a0;
  CURLU *local_98;
  dynbuf local_88;
  char *local_68;
  uint local_5c;
  char *local_58;
  dynbuf local_50;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  local_58 = part;
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      *(undefined8 *)&u->portnum = 0;
      return CURLUE_OK;
    case CURLUPART_SCHEME:
      u->field_0x52 = u->field_0x52 & 0xfb;
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u->field_0x52 = u->field_0x52 & 0xfe;
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u->field_0x52 = u->field_0x52 & 0xfd;
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      goto switchD_00165562_default;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  sVar8 = strlen(part);
  if (8000000 < sVar8) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (CURLUPART_ZONEID < what) {
switchD_00165562_default:
    return CURLUE_UNKNOWN_PART;
  }
  bVar2 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    if (sVar8 == 0) {
      CVar7 = curl_url_get(u,CURLUPART_URL,&local_88.bufr,flags);
      if (CVar7 == CURLUE_OK) {
        (*Curl_cfree)((void *)CONCAT62(local_88.bufr._2_6_,(unsigned_short)local_88.bufr));
        return CURLUE_OK;
      }
      return CURLUE_MALFORMED_INPUT;
    }
    sVar14 = Curl_is_absolute_url(part,(char *)0x0,buflen,(flags & 0x204) != 0);
    if ((sVar14 == 0) &&
       (CVar7 = curl_url_get(u,CURLUPART_URL,&local_88.bufr,flags), CVar7 == CURLUE_OK)) {
      CVar7 = redirect_url((char *)CONCAT62(local_88.bufr._2_6_,(unsigned_short)local_88.bufr),part,
                           u,flags);
      (*Curl_cfree)((void *)CONCAT62(local_88.bufr._2_6_,(unsigned_short)local_88.bufr));
      return CVar7;
    }
    CVar7 = parseurl_and_replace(part,u,flags);
    return CVar7;
  case CURLUPART_SCHEME:
    if (sVar8 - 0x29 < 0xffffffffffffffd8) {
      return CURLUE_BAD_SCHEME;
    }
    if (((flags & 8) == 0) &&
       (pCVar9 = Curl_get_scheme_handler(part), pCVar9 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    if (0x19 < (byte)((*part & 0xdfU) + 0xbf)) {
      return CURLUE_BAD_SCHEME;
    }
    if (sVar8 != 1) {
      lVar10 = 0;
      do {
        bVar2 = part[lVar10];
        if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
          if (0x2e < bVar2) {
            return CURLUE_BAD_SCHEME;
          }
          if ((0x680000000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
            return CURLUE_BAD_SCHEME;
          }
        }
        lVar10 = lVar10 + 1;
      } while (sVar8 - 1 != lVar10);
    }
    u->field_0x52 = u->field_0x52 & 0xfb;
    bVar16 = true;
    local_a0 = 0;
    uVar12 = 0;
    bVar2 = 0;
    local_98 = u;
    goto LAB_001657d2;
  case CURLUPART_USER:
    local_98 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_98 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_98 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_98 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    if (9 < (byte)(*part - 0x30U)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    iVar5 = Curl_str_number(&local_58,(curl_off_t *)&local_88,0xffff);
    if (iVar5 != 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*local_58 != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    pcVar11 = curl_maprintf("%ld",CONCAT62(local_88.bufr._2_6_,(unsigned_short)local_88.bufr));
    if (pcVar11 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(u->port);
    u->port = pcVar11;
    u->portnum = (unsigned_short)local_88.bufr;
    return CURLUE_OK;
  case CURLUPART_PATH:
    local_98 = (CURLU *)&u->path;
    uVar12 = 0x182b01;
    local_a0 = 0;
    bVar16 = true;
    goto LAB_001657d2;
  case CURLUPART_QUERY:
    bVar16 = -1 < (char)(byte)flags;
    local_a0 = flags >> 8;
    local_98 = (CURLU *)&u->query;
    u->field_0x52 = u->field_0x52 | 1;
    goto LAB_001657d0;
  case CURLUPART_FRAGMENT:
    u->field_0x52 = u->field_0x52 | 2;
    local_98 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_98 = (CURLU *)&u->zoneid;
  }
  bVar16 = true;
  local_a0 = 0;
LAB_001657d0:
  uVar12 = 0;
LAB_001657d2:
  local_5c = uVar12;
  Curl_dyn_init(&local_88,(ulong)(uVar12 & 0xff) + sVar8 * 3 + 1);
  if (((char)uVar12 != '\0') && (*part != '/')) {
    CVar6 = Curl_dyn_addn(&local_88,"/",1);
    CVar7 = CURLUE_OUT_OF_MEMORY;
    if (CVar6 == CURLE_TOO_LARGE) {
      CVar7 = CURLUE_TOO_LARGE;
    }
    if (CVar6 != CURLE_OK) {
      return CVar7;
    }
  }
  if (bVar2 == 0) {
    CVar6 = Curl_dyn_add(&local_88,part);
    if (CVar6 == CURLE_OK) {
      pcVar11 = Curl_dyn_ptr(&local_88);
      do {
        lVar10 = 1;
        if (*pcVar11 == '%') {
          bVar3 = pcVar11[1];
          if (((((byte)(bVar3 - 0x30) < 10) ||
               ((bVar3 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) != 0)
                ))) && ((bVar1 = pcVar11[2], (byte)(bVar1 - 0x30) < 10 ||
                        ((bVar1 - 0x41 < 0x26 &&
                         ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)))))) &&
             ((byte)(bVar3 + 0xbf) < 0x1a || (byte)(bVar1 + 0xbf) < 0x1a)) {
            cVar4 = Curl_raw_tolower(bVar3);
            pcVar11[1] = cVar4;
            cVar4 = Curl_raw_tolower(pcVar11[2]);
            pcVar11[2] = cVar4;
            lVar10 = 3;
          }
        }
        else if (*pcVar11 == '\0') goto LAB_001659fa;
        pcVar11 = pcVar11 + lVar10;
      } while( true );
    }
LAB_0016593d:
    if (CVar6 == CURLE_TOO_LARGE) {
      return CURLUE_TOO_LARGE;
    }
    return CURLUE_OUT_OF_MEMORY;
  }
  bVar3 = *part;
  if (bVar3 != 0) {
    uVar12 = local_a0;
    do {
      if ((bool)(bVar3 != 0x20 | bVar16)) {
        if (((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) {
LAB_001658ba:
          uVar13 = uVar12 & 0xff;
          uVar15 = uVar13;
          if ((uVar12 & 1) != 0) {
            uVar15 = 0;
          }
          uVar12 = uVar15;
          if (bVar3 != 0x3d) {
            uVar12 = uVar13;
          }
          sVar14 = 1;
          mem = (dynbuf *)part;
        }
        else {
          if (bVar3 < 0x3d) {
            if ((1 < bVar3 - 0x2d) && ((bVar3 != 0x2f || ((char)local_5c == '\0'))))
            goto LAB_00165902;
            goto LAB_001658ba;
          }
          if (bVar3 == 0x3d) {
            if ((uVar12 & 1) != 0) goto LAB_001658ba;
          }
          else if ((bVar3 == 0x5f) || (bVar3 == 0x7e)) goto LAB_001658ba;
LAB_00165902:
          local_50.bufr._2_1_ = 0;
          local_50.bufr._0_2_ = 0x25;
          Curl_hexbyte((uchar *)((long)&local_50.bufr + 1),bVar3,true);
          sVar14 = 3;
          mem = &local_50;
        }
        CVar6 = Curl_dyn_addn(&local_88,mem,sVar14);
        if (CVar6 != CURLE_OK) goto LAB_0016593d;
      }
      else {
        CVar6 = Curl_dyn_addn(&local_88,"+",1);
        if (CVar6 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      bVar3 = *(byte *)((long)&((dynbuf *)part)->bufr + 1);
      part = (char *)((long)&((dynbuf *)part)->bufr + 1);
    } while (bVar3 != 0);
  }
LAB_001659fa:
  pcVar11 = Curl_dyn_ptr(&local_88);
  if (((byte)local_a0 & pcVar11 != (char *)0x0) == 1) {
    __s = u->query;
    if ((__s != (char *)0x0) && (sVar8 = strlen(__s), sVar8 != 0)) {
      cVar4 = __s[sVar8 - 1];
      Curl_dyn_init(&local_50,8000000);
      CVar6 = Curl_dyn_addn(&local_50,u->query,sVar8);
      if ((CVar6 == CURLE_OK) &&
         (((cVar4 == '&' || (CVar6 = Curl_dyn_addn(&local_50,"&",1), CVar6 == CURLE_OK)) &&
          (CVar6 = Curl_dyn_add(&local_50,pcVar11), CVar6 == CURLE_OK)))) {
        Curl_dyn_free(&local_88);
        (*Curl_cfree)(local_98->scheme);
        pcVar11 = Curl_dyn_ptr(&local_50);
        local_98->scheme = pcVar11;
        return CURLUE_OK;
      }
      Curl_dyn_free(&local_88);
      return CURLUE_OUT_OF_MEMORY;
    }
  }
  else if ((what == CURLUPART_HOST) &&
          (sVar14 = Curl_dyn_len(&local_88), ((byte)(flags >> 10) & sVar14 == 0) == 0)) {
    if (sVar14 == 0) {
LAB_00165ba7:
      Curl_dyn_free(&local_88);
      return CURLUE_BAD_HOSTNAME;
    }
    if (bVar2 == 0) {
      local_68 = (char *)0x0;
      CVar6 = Curl_urldecode(pcVar11,sVar14,&local_68,(size_t *)&local_50,REJECT_CTRL);
      if ((CVar6 != CURLE_OK) ||
         (CVar7 = hostname_check(u,local_68,
                                 CONCAT53(local_50.bufr._3_5_,
                                          CONCAT12(local_50.bufr._2_1_,local_50.bufr._0_2_))),
         CVar7 != CURLUE_OK)) {
        (*Curl_cfree)(local_68);
        goto LAB_00165ba7;
      }
      (*Curl_cfree)(local_68);
    }
    else {
      CVar7 = hostname_check(u,pcVar11,sVar14);
      if (CVar7 != CURLUE_OK) goto LAB_00165ba7;
    }
  }
  (*Curl_cfree)(local_98->scheme);
  local_98->scheme = pcVar11;
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  bool urlencode = (flags & CURLU_URLENCODE) ? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool leadingslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;
  size_t nalloc;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      u->guessed_scheme = FALSE;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      u->query_present = FALSE;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      u->fragment_present = FALSE;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  nalloc = strlen(part);
  if(nalloc > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  switch(what) {
  case CURLUPART_SCHEME: {
    size_t plen = strlen(part);
    const char *s = part;
    if((plen > MAX_SCHEME_LEN) || (plen < 1))
      /* too long or too short */
      return CURLUE_BAD_SCHEME;
   /* verify that it is a fine scheme */
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) && !Curl_get_scheme_handler(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    if(ISALPHA(*s)) {
      /* ALPHA *( ALPHA / DIGIT / "+" / "-" / "." ) */
      while(--plen) {
        if(ISALNUM(*s) || (*s == '+') || (*s == '-') || (*s == '.'))
          s++; /* fine */
        else
          return CURLUE_BAD_SCHEME;
      }
    }
    else
      return CURLUE_BAD_SCHEME;
    u->guessed_scheme = FALSE;
    break;
  }
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
    if(!ISDIGIT(part[0]))
      /* not a number */
      return CURLUE_BAD_PORT_NUMBER;
    else {
      char *tmp;
      curl_off_t port;
      if(Curl_str_number(&part, &port, 0xffff) || *part)
        /* weirdly provided number, not good! */
        return CURLUE_BAD_PORT_NUMBER;
      tmp = aprintf("%" CURL_FORMAT_CURL_OFF_T, port);
      if(!tmp)
        return CURLUE_OUT_OF_MEMORY;
      free(u->port);
      u->port = tmp;
      u->portnum = (unsigned short)port;
      return CURLUE_OK;
    }
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    leadingslash = TRUE; /* enforce */
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY) ? 1 : 0;
    equalsencode = appendquery;
    storep = &u->query;
    u->query_present = TRUE;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    u->fragment_present = TRUE;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode uc;
    char *oldurl;

    if(!nalloc) {
      /* a blank URL is not a valid URL unless we already have a complete one
         and this is a redirect */
      if(!curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
        /* success, meaning the "" is a fine relative URL, but nothing
           changes */
        free(oldurl);
        return CURLUE_OK;
      }
      return CURLUE_MALFORMED_INPUT;
    }

    /* if the new thing is absolute or the old one is not (we could not get an
     * absolute URL in 'oldurl'), then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }
    DEBUGASSERT(oldurl); /* it is set here */
    /* apply the relative part to create a new URL */
    uc = redirect_url(oldurl, part, u, flags);
    free(oldurl);
    return uc;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp;
    struct dynbuf enc;
    Curl_dyn_init(&enc, nalloc * 3 + 1 + leadingslash);

    if(leadingslash && (part[0] != '/')) {
      CURLcode result = Curl_dyn_addn(&enc, "/", 1);
      if(result)
        return cc2cu(result);
    }
    if(urlencode) {
      const unsigned char *i;

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(ISUNRESERVED(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return cc2cu(result);
        }
        else {
          unsigned char out[3]={'%'};
          Curl_hexbyte(&out[1], *i, TRUE);
          result = Curl_dyn_addn(&enc, out, 3);
          if(result)
            return cc2cu(result);
        }
      }
    }
    else {
      char *p;
      CURLcode result = Curl_dyn_add(&enc, part);
      if(result)
        return cc2cu(result);
      p = Curl_dyn_ptr(&enc);
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }
    newp = Curl_dyn_ptr(&enc);

    if(appendquery && newp) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf qbuf;
        Curl_dyn_init(&qbuf, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&qbuf, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&qbuf, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&qbuf, newp))
          goto nomem;
        Curl_dyn_free(&enc);
        free(*storep);
        *storep = Curl_dyn_ptr(&qbuf);
        return CURLUE_OK;
nomem:
        Curl_dyn_free(&enc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    else if(what == CURLUPART_HOST) {
      size_t n = Curl_dyn_len(&enc);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it is allowed to be empty. */
      }
      else {
        bool bad = FALSE;
        if(!n)
          bad = TRUE; /* empty hostname is not okay */
        else if(!urlencode) {
          /* if the host name part was not URL encoded here, it was set ready
             URL encoded so we need to decode it to check */
          size_t dlen;
          char *decoded = NULL;
          CURLcode result =
            Curl_urldecode(newp, n, &decoded, &dlen, REJECT_CTRL);
          if(result || hostname_check(u, decoded, dlen))
            bad = TRUE;
          free(decoded);
        }
        else if(hostname_check(u, (char *)CURL_UNCONST(newp), n))
          bad = TRUE;
        if(bad) {
          Curl_dyn_free(&enc);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)CURL_UNCONST(newp);
  }
  return CURLUE_OK;
}